

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlOutputBufferClose(xmlOutputBufferPtr out)

{
  int iVar1;
  int iVar2;
  
  if (out == (xmlOutputBufferPtr)0x0) {
    iVar1 = -1;
  }
  else {
    if (out->writecallback != (xmlOutputWriteCallback)0x0) {
      xmlOutputBufferFlush(out);
    }
    if (out->closecallback != (xmlOutputCloseCallback)0x0) {
      iVar1 = (*out->closecallback)(out->context);
      if (iVar1 != 0) {
        iVar2 = xmlIsCatastrophicError(3,out->error);
        if (iVar2 == 0) {
          iVar2 = 0x5dc;
          if (-1 < iVar1) {
            iVar2 = iVar1;
          }
          out->error = iVar2;
        }
      }
    }
    if (out->error == 0) {
      iVar1 = out->written;
    }
    else {
      iVar1 = -out->error;
    }
    if (out->conv != (xmlBufPtr)0x0) {
      xmlBufFree(out->conv);
      out->conv = (xmlBufPtr)0x0;
    }
    if (out->encoder != (xmlCharEncodingHandler *)0x0) {
      xmlCharEncCloseFunc(out->encoder);
    }
    if (out->buffer != (xmlBufPtr)0x0) {
      xmlBufFree(out->buffer);
      out->buffer = (xmlBufPtr)0x0;
    }
    (*xmlFree)(out);
  }
  return iVar1;
}

Assistant:

int
xmlOutputBufferClose(xmlOutputBufferPtr out)
{
    int ret;

    if (out == NULL)
        return (-1);

    if (out->writecallback != NULL)
        xmlOutputBufferFlush(out);

    if (out->closecallback != NULL) {
        int code = out->closecallback(out->context);

        if ((code != XML_ERR_OK) &&
            (!xmlIsCatastrophicError(XML_ERR_FATAL, out->error))) {
            if (code < 0)
                out->error = XML_IO_UNKNOWN;
            else
                out->error = code;
        }
    }

    if (out->error != XML_ERR_OK)
        ret = -out->error;
    else
        ret = out->written;

    if (out->conv) {
        xmlBufFree(out->conv);
        out->conv = NULL;
    }
    if (out->encoder != NULL) {
        xmlCharEncCloseFunc(out->encoder);
    }
    if (out->buffer != NULL) {
        xmlBufFree(out->buffer);
        out->buffer = NULL;
    }

    xmlFree(out);

    return(ret);
}